

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_miner.cpp
# Opt level: O1

void __thiscall
node::MiniMiner::MiniMiner
          (MiniMiner *this,
          vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
          *manual_entries,
          map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
          *descendant_caches)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  pointer *pp_Var3;
  MiniMinerMempoolEntry *pMVar4;
  iterator __position;
  const_iterator cVar5;
  _Base_ptr p_Var6;
  _Rb_tree_node_base *p_Var7;
  Txid *__k;
  MiniMinerMempoolEntry *entry;
  MiniMinerMempoolEntry *__args_1;
  long in_FS_OFFSET;
  bool bVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_bool> pVar9;
  iterator desc_it;
  vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
  descendants;
  _Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> local_60;
  undefined1 local_58 [8];
  pointer p_Stack_50;
  pointer local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->m_ready_to_calculate = true;
  p_Var1 = &(this->m_to_be_replaced)._M_t._M_impl.super__Rb_tree_header;
  (this->m_to_be_replaced)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_to_be_replaced)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_to_be_replaced)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->m_to_be_replaced)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_to_be_replaced)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_requested_outpoints_by_txid)._M_t._M_impl.super__Rb_tree_header;
  (this->m_requested_outpoints_by_txid)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->m_requested_outpoints_by_txid)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_requested_outpoints_by_txid)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_requested_outpoints_by_txid)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_requested_outpoints_by_txid)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_inclusion_order)._M_t._M_impl.super__Rb_tree_header;
  (this->m_inclusion_order)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_inclusion_order)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_inclusion_order)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_inclusion_order)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_inclusion_order)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_bump_fees)._M_t._M_impl.super__Rb_tree_header;
  (this->m_bump_fees)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_bump_fees)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_bump_fees)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_bump_fees)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_bump_fees)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_in_block)._M_t._M_impl.super__Rb_tree_header;
  (this->m_in_block)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_in_block)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_in_block)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_in_block)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->m_entries_by_txid)._M_t._M_impl.super__Rb_tree_header;
  (this->m_entries_by_txid)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_entries_by_txid)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->m_total_vsize = 0;
  (this->m_in_block)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_total_fees = 0;
  (this->m_entries_by_txid)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_entries_by_txid)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var2 = &(this->m_descendant_set_by_txid)._M_t._M_impl.super__Rb_tree_header;
  (this->m_descendant_set_by_txid)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_descendant_set_by_txid)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_entries_by_txid)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_entries).
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_entries).
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_entries).
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_descendant_set_by_txid)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->m_descendant_set_by_txid)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->m_descendant_set_by_txid)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __args_1 = *(MiniMinerMempoolEntry **)manual_entries;
  pMVar4 = *(MiniMinerMempoolEntry **)(manual_entries + 8);
  bVar8 = __args_1 == pMVar4;
  if (!bVar8) {
    do {
      __k = &((__args_1->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->hash;
      cVar5 = std::
              _Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
              ::find((_Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
                      *)descendant_caches,__k);
      if (cVar5._M_node == (_Base_ptr)(descendant_caches + 8)) {
        this->m_ready_to_calculate = false;
      }
      else {
        pVar9 = std::
                _Rb_tree<uint256,std::pair<uint256_const,node::MiniMinerMempoolEntry>,std::_Select1st<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::less<uint256>,std::allocator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>
                ::
                _M_emplace_unique<transaction_identifier<false>const&,node::MiniMinerMempoolEntry_const&>
                          ((_Rb_tree<uint256,std::pair<uint256_const,node::MiniMinerMempoolEntry>,std::_Select1st<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::less<uint256>,std::allocator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>
                            *)&this->m_entries_by_txid,__k,__args_1);
        local_58 = (undefined1  [8])pVar9.first._M_node;
        p_Stack_50 = (pointer)CONCAT71(p_Stack_50._1_7_,pVar9.second);
        if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          __position._M_current =
               (this->m_entries).
               super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->m_entries).
              super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>
            ::
            _M_realloc_insert<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>const&>
                      ((vector<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>
                        *)&this->m_entries,__position,
                       (_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *)
                       local_58);
          }
          else {
            (__position._M_current)->_M_node = (_Base_ptr)local_58;
            pp_Var3 = &(this->m_entries).
                       super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pp_Var3 = *pp_Var3 + 1;
          }
        }
      }
      if (cVar5._M_node == (_Base_ptr)(descendant_caches + 8)) {
        if (!bVar8) goto LAB_0027369b;
        break;
      }
      __args_1 = __args_1 + 1;
      bVar8 = __args_1 == pMVar4;
    } while (!bVar8);
  }
  p_Var7 = *(_Rb_tree_node_base **)(descendant_caches + 0x18);
  do {
    if (p_Var7 == (_Rb_tree_node_base *)(descendant_caches + 8)) {
LAB_00273693:
      SanityCheck(this);
LAB_0027369b:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
    if (p_Var7[3]._M_parent == (_Base_ptr)0x0) {
      this->m_ready_to_calculate = false;
LAB_0027368c:
      if (p_Var7 != (_Rb_tree_node_base *)(descendant_caches + 8)) goto LAB_0027369b;
      goto LAB_00273693;
    }
    local_58 = (undefined1  [8])0x0;
    p_Stack_50 = (pointer)0x0;
    local_48 = (pointer)0x0;
    for (p_Var6 = p_Var7[2]._M_right; bVar8 = p_Var6 != (_Base_ptr)&p_Var7[2]._M_parent, bVar8;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      local_60._M_node =
           (_Base_ptr)
           std::
           _Rb_tree<uint256,_std::pair<const_uint256,_node::MiniMinerMempoolEntry>,_std::_Select1st<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
           ::find(&(this->m_entries_by_txid)._M_t,(key_type *)(p_Var6 + 1));
      if ((_Rb_tree_header *)local_60._M_node == p_Var1) {
        this->m_ready_to_calculate = false;
        if (bVar8) goto LAB_0027364d;
        break;
      }
      std::
      vector<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>
      ::emplace_back<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>&>
                ((vector<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>
                  *)local_58,&local_60);
    }
    std::
    _Rb_tree<uint256,std::pair<uint256_const,std::vector<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>>,std::_Select1st<std::pair<uint256_const,std::vector<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::vector<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>>>>
    ::
    _M_emplace_unique<transaction_identifier<false>const&,std::vector<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>&>
              ((_Rb_tree<uint256,std::pair<uint256_const,std::vector<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>>,std::_Select1st<std::pair<uint256_const,std::vector<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::vector<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>>>>
                *)&this->m_descendant_set_by_txid,(transaction_identifier<false> *)(p_Var7 + 1),
               (vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                *)local_58);
LAB_0027364d:
    if (local_58 != (undefined1  [8])0x0) {
      operator_delete((void *)local_58,(long)local_48 - (long)local_58);
    }
    if (bVar8) goto LAB_0027368c;
    p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
  } while( true );
}

Assistant:

MiniMiner::MiniMiner(const std::vector<MiniMinerMempoolEntry>& manual_entries,
                     const std::map<Txid, std::set<Txid>>& descendant_caches)
{
    for (const auto& entry : manual_entries) {
        const auto& txid = entry.GetTx().GetHash();
        // We need to know the descendant set of every transaction.
        if (!Assume(descendant_caches.count(txid) > 0)) {
            m_ready_to_calculate = false;
            return;
        }
        // Just forward these args onto MiniMinerMempoolEntry
        auto [mapiter, success] = m_entries_by_txid.emplace(txid, entry);
        // Txids must be unique; this txid shouldn't already be an entry in m_entries_by_txid
        if (Assume(success)) m_entries.push_back(mapiter);
    }
    // Descendant cache is already built, but we need to translate them to m_entries_by_txid iters.
    for (const auto& [txid, desc_txids] : descendant_caches) {
        // Descendant cache should include at least the tx itself.
        if (!Assume(!desc_txids.empty())) {
            m_ready_to_calculate = false;
            return;
        }
        std::vector<MockEntryMap::iterator> descendants;
        for (const auto& desc_txid : desc_txids) {
            auto desc_it{m_entries_by_txid.find(desc_txid)};
            // Descendants should only include transactions with corresponding entries.
            if (!Assume(desc_it != m_entries_by_txid.end())) {
                m_ready_to_calculate = false;
                return;
            } else {
                descendants.emplace_back(desc_it);
            }
        }
        m_descendant_set_by_txid.emplace(txid, descendants);
    }
    Assume(m_to_be_replaced.empty());
    Assume(m_requested_outpoints_by_txid.empty());
    Assume(m_bump_fees.empty());
    Assume(m_inclusion_order.empty());
    SanityCheck();
}